

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classic.cpp
# Opt level: O2

bool __thiscall ClassicMapGenerator::generate(ClassicMapGenerator *this)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  Area local_34;
  
  do_rooms(this);
  for (lVar3 = 0x14; lVar3 != 0x470; lVar3 = lVar3 + 0x7c) {
    if ((*(byte *)((long)this->rooms[0].r_exit + lVar3 + -0x1c) & 2) == 0) {
      Area::Area(&local_34);
      uVar1 = *(undefined8 *)((long)(this->rooms[0].r_exit + -6) + lVar3);
      local_34.position.x = (int)uVar1 + 1;
      local_34.position.y = (int)((ulong)uVar1 >> 0x20) + 1;
      uVar1 = *(undefined8 *)((long)(this->rooms[0].r_exit + -5) + lVar3);
      local_34.size.x = (int)uVar1 + -2;
      local_34.size.y = (int)((ulong)uVar1 >> 0x20) + -2;
      std::vector<Area,_std::allocator<Area>_>::push_back(&areas,&local_34);
    }
  }
  do_passages(this);
  if ((amulet == false) && (level == max_level)) {
    iVar2 = rnd(0x14);
    if (iVar2 == 0) {
      treas_room(this);
    }
  }
  placeRandomItems();
  placeAmuletIfRequired();
  placeRandomTraps();
  placeRandomStairs();
  placeRandomHero();
  return true;
}

Assistant:

bool ClassicMapGenerator::generate()
{
    do_rooms();     /* Draw rooms */
    //Build the area definitions from the room definitions.
    for(int n=0; n<MAXROOMS; n++)
    {
        if (rooms[n].r_flags & ISGONE)
            continue;
        Area area;
        area.position = rooms[n].r_pos;
        area.position.x += 1;
        area.position.y += 1;
        area.size = rooms[n].r_max;
        area.size.x -= 2;
        area.size.y -= 2;
        areas.push_back(area);
    }
    do_passages();  /* Draw passages */

    /*
     * check for treasure rooms, and if so, put it in.
     */
    if (!amulet && level == max_level && rnd(TREAS_ROOM) == 0)
        treas_room();

    placeRandomItems();
    placeAmuletIfRequired();
    placeRandomTraps();
    placeRandomStairs();
    placeRandomHero();
    
    return true;
}